

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O3

void mserialize::detail::
     BuiltinSerializer<std::vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>,_void>
     ::serialize<OutputStream>
               (vector<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_> *s,
               OutputStream *ostream)

{
  pointer ptVar1;
  tuple<char,_int> *elem;
  pointer ptVar2;
  undefined4 local_1c;
  
  local_1c = (undefined4)
             ((ulong)((long)(s->
                            super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(s->
                           super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3);
  std::ostream::write((char *)(ostream->stream + 0x10),(long)&local_1c);
  ptVar1 = (s->super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (ptVar2 = (s->
                super__Vector_base<std::tuple<char,_int>,_std::allocator<std::tuple<char,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    BuiltinSerializer<std::tuple<char,int>,void>::serialize_elems<OutputStream,0ul,1ul>
              (ptVar2,ostream);
  }
  return;
}

Assistant:

static void serialize(const Sequence& s, OutputStream& ostream)
  {
    const auto size = sequence_size(s);
    const auto size32 = std::uint32_t(size);
    assert(size32 == size && "sequence size must fit on 32 bits");

    mserialize::serialize(size32, ostream);
    serialize_elems(is_sequence_batch_serializable<const Sequence>{}, s, size32, ostream);
  }